

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001933a0 = 0x2e2e2e2e2e2e2e;
    uRam00000000001933a7._0_1_ = '.';
    uRam00000000001933a7._1_1_ = '.';
    uRam00000000001933a7._2_1_ = '.';
    uRam00000000001933a7._3_1_ = '.';
    uRam00000000001933a7._4_1_ = '.';
    uRam00000000001933a7._5_1_ = '.';
    uRam00000000001933a7._6_1_ = '.';
    uRam00000000001933a7._7_1_ = '.';
    DAT_00193390 = '.';
    DAT_00193390_1._0_1_ = '.';
    DAT_00193390_1._1_1_ = '.';
    DAT_00193390_1._2_1_ = '.';
    DAT_00193390_1._3_1_ = '.';
    DAT_00193390_1._4_1_ = '.';
    DAT_00193390_1._5_1_ = '.';
    DAT_00193390_1._6_1_ = '.';
    uRam0000000000193398 = 0x2e2e2e2e2e2e2e;
    DAT_0019339f = 0x2e;
    DAT_00193380 = '.';
    DAT_00193380_1._0_1_ = '.';
    DAT_00193380_1._1_1_ = '.';
    DAT_00193380_1._2_1_ = '.';
    DAT_00193380_1._3_1_ = '.';
    DAT_00193380_1._4_1_ = '.';
    DAT_00193380_1._5_1_ = '.';
    DAT_00193380_1._6_1_ = '.';
    uRam0000000000193388._0_1_ = '.';
    uRam0000000000193388._1_1_ = '.';
    uRam0000000000193388._2_1_ = '.';
    uRam0000000000193388._3_1_ = '.';
    uRam0000000000193388._4_1_ = '.';
    uRam0000000000193388._5_1_ = '.';
    uRam0000000000193388._6_1_ = '.';
    uRam0000000000193388._7_1_ = '.';
    DAT_00193370 = '.';
    DAT_00193370_1._0_1_ = '.';
    DAT_00193370_1._1_1_ = '.';
    DAT_00193370_1._2_1_ = '.';
    DAT_00193370_1._3_1_ = '.';
    DAT_00193370_1._4_1_ = '.';
    DAT_00193370_1._5_1_ = '.';
    DAT_00193370_1._6_1_ = '.';
    uRam0000000000193378._0_1_ = '.';
    uRam0000000000193378._1_1_ = '.';
    uRam0000000000193378._2_1_ = '.';
    uRam0000000000193378._3_1_ = '.';
    uRam0000000000193378._4_1_ = '.';
    uRam0000000000193378._5_1_ = '.';
    uRam0000000000193378._6_1_ = '.';
    uRam0000000000193378._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000193368._0_1_ = '.';
    uRam0000000000193368._1_1_ = '.';
    uRam0000000000193368._2_1_ = '.';
    uRam0000000000193368._3_1_ = '.';
    uRam0000000000193368._4_1_ = '.';
    uRam0000000000193368._5_1_ = '.';
    uRam0000000000193368._6_1_ = '.';
    uRam0000000000193368._7_1_ = '.';
    DAT_001933af = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}